

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O2

Result __thiscall
tonk::HostnameResolverState::GetNextServerAddress(HostnameResolverState *this,address *addr)

{
  uint32_t uVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  undefined8 *puVar7;
  long lVar8;
  address *in_RDX;
  uint uVar9;
  uint uVar10;
  allocator local_39;
  address local_38;
  
  uVar2 = *(unsigned_long *)((long)&(addr->ipv6_address_).addr_.__in6_u + 8);
  uVar3 = (addr->ipv6_address_).scope_id_;
  if (uVar2 == uVar3) {
    std::__cxx11::string::string((string *)&local_38,"Hostname did not resolve",&local_39);
    puVar7 = (undefined8 *)operator_new(0x38);
    *puVar7 = "Connection failed";
    std::__cxx11::string::string((string *)(puVar7 + 1),(string *)&local_38);
  }
  else {
    uVar1 = addr[1].ipv6_address_.addr_.__in6_u.__u6_addr32[1];
    uVar10 = addr[1].ipv6_address_.addr_.__in6_u.__u6_addr32[0] + 1;
    uVar9 = 0;
    if (uVar10 < (uint)(uVar3 - uVar2 >> 5)) {
      uVar9 = uVar10;
    }
    addr[1].ipv6_address_.addr_.__in6_u.__u6_addr32[0] = uVar9;
    if (uVar1 != 0) {
      addr[1].ipv6_address_.addr_.__in6_u.__u6_addr32[1] = uVar1 - 1;
      lVar8 = (ulong)uVar9 * 0x20;
      uVar4 = *(undefined8 *)(uVar2 + lVar8);
      in_RDX->type_ = (int)uVar4;
      in_RDX->ipv4_address_ = (address_v4)(int)((ulong)uVar4 >> 0x20);
      puVar7 = (undefined8 *)(uVar2 + 8 + lVar8);
      uVar5 = puVar7[1];
      *(undefined8 *)&(in_RDX->ipv6_address_).addr_.__in6_u = *puVar7;
      *(undefined8 *)((long)&(in_RDX->ipv6_address_).addr_.__in6_u + 8) = uVar5;
      (in_RDX->ipv6_address_).scope_id_ = *(unsigned_long *)(uVar2 + 0x18 + lVar8);
      if ((int)uVar4 != 0) {
        bVar6 = asio::ip::address::is_loopback(in_RDX);
        if (bVar6) {
          in_RDX->type_ = ipv4;
          in_RDX->ipv4_address_ = (in4_addr_type)0x100007f;
        }
        else {
          asio::ip::address::to_v4(&local_38);
          in_RDX->type_ = ipv4;
          (in_RDX->ipv4_address_).addr_.s_addr = local_38.type_;
        }
        (in_RDX->ipv6_address_).scope_id_ = 0;
        *(undefined8 *)&(in_RDX->ipv6_address_).addr_.__in6_u = 0;
        *(undefined8 *)((long)&(in_RDX->ipv6_address_).addr_.__in6_u + 8) = 0;
      }
      *(undefined8 *)this = 0;
      return (Result)(ErrorResult *)this;
    }
    std::__cxx11::string::string((string *)&local_38,"No servers responded",&local_39);
    puVar7 = (undefined8 *)operator_new(0x38);
    *puVar7 = "Connection failed";
    std::__cxx11::string::string((string *)(puVar7 + 1),(string *)&local_38);
  }
  *(undefined4 *)(puVar7 + 5) = 0;
  puVar7[6] = 0xb;
  *(undefined8 **)this = puVar7;
  std::__cxx11::string::~string((string *)&local_38);
  return (Result)(ErrorResult *)this;
}

Assistant:

Result HostnameResolverState::GetNextServerAddress(asio::ip::address& addr)
{
    // If there are no TCP addresses resolved:
    if (ResolvedIPAddresses.empty()) {
        return Result("Connection failed", "Hostname did not resolve", ErrorType::Tonk, Tonk_ConnectionTimeout);
    }

    // Try the next connection address
    if (++ConnectAddrIndex >= static_cast<unsigned>(ResolvedIPAddresses.size())) {
        ConnectAddrIndex = 0;
    }

    // Try once per server in the list
    if (ConnectRequestsRemaining <= 0) {
        return Result("Connection failed", "No servers responded", ErrorType::Tonk, Tonk_ConnectionTimeout);
    }
    --ConnectRequestsRemaining;

    addr = ResolvedIPAddresses[ConnectAddrIndex];
    if (addr.is_v4()) {
        return Result::Success();
    }

    try
    {
        // Workaround fix: IPv6 loopback is not handled properly by asio to_v4()
        if (addr.is_loopback())
        {
            addr = asio::ip::address_v4::loopback();
            return Result::Success();
        }

        addr = addr.to_v4();
    }
    catch (...)
    {
    }

    // Unable to convert, keep as IPv6
    return Result::Success();
}